

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void array_container_andnot
               (array_container_t *array_1,array_container_t *array_2,array_container_t *out)

{
  long lVar1;
  int32_t iVar2;
  
  if (out->capacity < array_1->cardinality) {
    array_container_grow(out,array_1->cardinality,false);
  }
  lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
  if (((out == array_2) || (out == array_1)) || ((*(uint *)(lVar1 + 4) & 0x20) == 0)) {
    iVar2 = difference_uint16(array_1->array,array_1->cardinality,array_2->array,
                              array_2->cardinality,out->array);
  }
  else {
    iVar2 = difference_vector16(array_1->array,(long)array_1->cardinality,array_2->array,
                                (long)array_2->cardinality,out->array);
  }
  out->cardinality = iVar2;
  return;
}

Assistant:

void array_container_andnot(const array_container_t *array_1,
                            const array_container_t *array_2,
                            array_container_t *out) {
    if (out->capacity < array_1->cardinality)
        array_container_grow(out, array_1->cardinality, false);
#ifdef CROARING_IS_X64
    if(( croaring_avx2() ) && (out != array_1) && (out != array_2)) {
      out->cardinality =
          difference_vector16(array_1->array, array_1->cardinality,
                            array_2->array, array_2->cardinality, out->array);
     } else {
      out->cardinality =
        difference_uint16(array_1->array, array_1->cardinality, array_2->array,
                          array_2->cardinality, out->array);
     }
#else
    out->cardinality =
        difference_uint16(array_1->array, array_1->cardinality, array_2->array,
                          array_2->cardinality, out->array);
#endif
}